

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.h
# Opt level: O3

void __thiscall PoolResource<128UL,_8UL>::~PoolResource(PoolResource<128UL,_8UL> *this)

{
  long lVar1;
  _List_node_base *p_Var2;
  list<std::byte_*,_std::allocator<std::byte_*>_> *plVar3;
  _Node *__tmp;
  _List_node_base *p_Var4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var4 = (this->m_allocated_chunks).super__List_base<std::byte_*,_std::allocator<std::byte_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  plVar3 = &this->m_allocated_chunks;
  if (p_Var4 != (_List_node_base *)plVar3) {
    do {
      operator_delete(p_Var4[1]._M_next,8);
      p_Var4 = p_Var4->_M_next;
    } while (p_Var4 != (_List_node_base *)plVar3);
    p_Var4 = (plVar3->super__List_base<std::byte_*,_std::allocator<std::byte_*>_>)._M_impl._M_node.
             super__List_node_base._M_next;
  }
  while (p_Var4 != (_List_node_base *)plVar3) {
    p_Var2 = p_Var4->_M_next;
    operator_delete(p_Var4,0x18);
    p_Var4 = p_Var2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~PoolResource()
    {
        for (std::byte* chunk : m_allocated_chunks) {
            std::destroy(chunk, chunk + m_chunk_size_bytes);
            ::operator delete ((void*)chunk, std::align_val_t{ELEM_ALIGN_BYTES});
        }
    }